

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.c
# Opt level: O1

trie_node * trie_remove(trie_node *root,lrtr_ip_addr *prefix,uint8_t mask_len,uint lvl)

{
  long lVar1;
  void *pvVar2;
  undefined1 (*pauVar3) [12];
  undefined8 uVar4;
  lrtr_ip_addr a;
  lrtr_ip_addr prefix_00;
  lrtr_ip_addr b;
  _Bool _Var5;
  trie_node *ptVar6;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff9c;
  lrtr_ip_version in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined8 uStack_40;
  undefined4 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  while (root->len == mask_len) {
    local_38 = (((trie_node *)prefix)->prefix).u.addr6.addr[3];
    pauVar3 = (undefined1 (*) [12])((long)&(((trie_node *)prefix)->prefix).u + 4);
    uStack_40 = *(undefined8 *)*pauVar3;
    in_stack_ffffffffffffffa0 = (lrtr_ip_version)*(undefined8 *)&((trie_node *)prefix)->prefix;
    a.u.addr6.addr[2] = in_stack_ffffffffffffff9c;
    a._0_12_ = *(undefined1 (*) [12])((long)&(root->prefix).u + 4);
    a.u.addr6.addr[3] = in_stack_ffffffffffffffa0;
    b.u.addr6.addr[2] = in_stack_ffffffffffffffb4;
    b._0_12_ = *pauVar3;
    b.u.addr6.addr[3] = in_stack_ffffffffffffffa0;
    _Var5 = lrtr_ip_addr_equal(a,b);
    if (!_Var5) break;
    prefix = &root->lchild->prefix;
    if ((trie_node *)prefix == (trie_node *)0x0) {
      if (root->rchild == (trie_node *)0x0) {
        ptVar6 = root->parent;
        if (ptVar6 != (trie_node *)0x0) {
          if (ptVar6->lchild == root) {
            ptVar6->lchild = (trie_node *)0x0;
          }
          else {
            ptVar6->rchild = (trie_node *)0x0;
          }
        }
        goto LAB_00102616;
      }
LAB_00102585:
      prefix = &root->rchild->prefix;
    }
    else if ((root->rchild != (trie_node *)0x0) && (root->rchild->len <= ((trie_node *)prefix)->len)
            ) goto LAB_00102585;
    pvVar2 = root->data;
    uVar4 = *(undefined8 *)((long)&(((trie_node *)prefix)->prefix).u + 4);
    *(undefined8 *)&root->prefix = *(undefined8 *)&((trie_node *)prefix)->prefix;
    *(undefined8 *)((long)&(root->prefix).u + 4) = uVar4;
    (root->prefix).u.addr6.addr[3] = (((trie_node *)prefix)->prefix).u.addr6.addr[3];
    root->len = ((trie_node *)prefix)->len;
    root->data = ((trie_node *)prefix)->data;
    ((trie_node *)prefix)->data = pvVar2;
    lvl = lvl + 1;
    root = (trie_node *)prefix;
    mask_len = ((trie_node *)prefix)->len;
  }
  lrtr_ip_addr_get_bits((lrtr_ip_addr *)&stack0xffffffffffffffb8,prefix,(uint8_t)lvl,'\x01');
  prefix_00.u.addr6.addr[1] = local_38;
  prefix_00._0_8_ = uStack_40;
  prefix_00.u.addr6.addr[2] = in_stack_ffffffffffffff9c;
  prefix_00.u.addr6.addr[3] = in_stack_ffffffffffffffa0;
  _Var5 = lrtr_ip_addr_is_zero(prefix_00);
  if (_Var5) {
    ptVar6 = root->lchild;
  }
  else {
    ptVar6 = root->rchild;
  }
  if (ptVar6 == (trie_node *)0x0) {
    root = (trie_node *)0x0;
  }
  else {
    root = trie_remove(ptVar6,prefix,mask_len,lvl + 1);
  }
LAB_00102616:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return root;
  }
  __stack_chk_fail();
}

Assistant:

struct trie_node *trie_remove(struct trie_node *root, const struct lrtr_ip_addr *prefix, const uint8_t mask_len,
			      const unsigned int lvl)
{
	/* If the node has no children we can simply remove it
	 * If the node has children, we swap the node with the child that
	 * has the smaller prefix length and drop the child.
	 */
	if (prefix_is_same(root, prefix, mask_len)) {
		void *tmp;

		if (trie_is_leaf(root)) {
			deref_node(root);
			return root;
		}

		/* swap with the left child and drop the child */
		if (root->lchild && (!root->rchild || root->lchild->len < root->rchild->len)) {
			tmp = root->data;
			replace_node_data(root, root->lchild);
			root->lchild->data = tmp;

			return trie_remove(root->lchild, &root->lchild->prefix, root->lchild->len, lvl + 1);
		}

		/* swap with the right child and drop the child */
		tmp = root->data;
		replace_node_data(root, root->rchild);
		root->rchild->data = tmp;

		return trie_remove(root->rchild, &root->rchild->prefix, root->rchild->len, lvl + 1);
	}

	if (is_left_child(prefix, lvl)) {
		if (!root->lchild)
			return NULL;
		return trie_remove(root->lchild, prefix, mask_len, lvl + 1);
	}

	if (!root->rchild)
		return NULL;
	return trie_remove(root->rchild, prefix, mask_len, lvl + 1);
}